

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

string * cm_archive_error_string_abi_cxx11_(string *__return_storage_ptr__,archive *a)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_9;
  
  pcVar1 = archive_error_string(a);
  pcVar2 = "unknown error";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

static std::string cm_archive_error_string(struct archive* a)
{
  const char* e = archive_error_string(a);
  return e ? e : "unknown error";
}